

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_argsort(ggml_compute_params *params,ggml_tensor *dst)

{
  int iVar1;
  int iVar2;
  ggml_tensor *pgVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  void *pvVar8;
  long lVar9;
  ulong uVar10;
  int32_t tmp;
  int iVar11;
  int64_t i;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  
  pgVar3 = dst->src[0];
  if (pgVar3->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1ac3,"fatal error");
  }
  if (dst->nb[0] != 4) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1a97,"GGML_ASSERT(%s) failed","nb0 == sizeof(float)");
  }
  uVar4 = dst->ne[0];
  sVar5 = dst->nb[1];
  lVar12 = (long)params->ith;
  iVar1 = params->nth;
  sVar6 = pgVar3->nb[1];
  lVar9 = ggml_nrows(pgVar3);
  iVar2 = dst->op_params[0];
  lVar13 = sVar5 * lVar12;
  uVar10 = ~((long)uVar4 >> 0x3f) & uVar4;
  do {
    if (lVar9 <= lVar12) {
      return;
    }
    lVar14 = lVar12 * sVar5;
    pvVar7 = dst->data;
    pvVar8 = pgVar3->data;
    for (uVar15 = 0; uVar10 != uVar15; uVar15 = uVar15 + 1) {
      *(int *)((long)pvVar7 + uVar15 * 4 + lVar13) = (int)uVar15;
    }
    lVar16 = lVar12 * sVar6;
    uVar15 = 0;
    while (uVar17 = uVar15, uVar17 != uVar10) {
      for (uVar19 = uVar17 + 1; uVar15 = uVar17 + 1, (long)uVar19 < (long)uVar4; uVar19 = uVar19 + 1
          ) {
        if (iVar2 == 1) {
          iVar18 = *(int *)((long)pvVar7 + uVar19 * 4 + lVar13);
          iVar11 = *(int *)((long)pvVar7 + uVar17 * 4 + lVar14);
          if (*(float *)((long)pvVar8 + (long)iVar11 * 4 + lVar16) <
              *(float *)((long)pvVar8 + (long)iVar18 * 4 + lVar16)) {
LAB_001404d3:
            *(int *)((long)pvVar7 + uVar17 * 4 + lVar14) = iVar18;
            *(int *)((long)pvVar7 + uVar19 * 4 + lVar13) = iVar11;
          }
        }
        else if (iVar2 == 0) {
          iVar11 = *(int *)((long)pvVar7 + uVar17 * 4 + lVar14);
          iVar18 = *(int *)((long)pvVar7 + uVar19 * 4 + lVar13);
          if (*(float *)((long)pvVar8 + (long)iVar18 * 4 + lVar16) <
              *(float *)((long)pvVar8 + (long)iVar11 * 4 + lVar16)) goto LAB_001404d3;
        }
      }
    }
    lVar12 = lVar12 + iVar1;
    lVar13 = lVar13 + sVar5 * (long)iVar1;
  } while( true );
}

Assistant:

void ggml_compute_forward_argsort(
    const ggml_compute_params * params,
    ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_argsort_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}